

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_gcn_shader_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  uint32_t op0;
  char *op;
  allocator local_4d;
  uint32_t eop_local;
  string expr;
  
  eop_local = eop;
  ::std::__cxx11::string::string((string *)&expr,"GL_AMD_gcn_shader",&local_4d);
  require_extension_internal(this,&expr);
  ::std::__cxx11::string::~string((string *)&expr);
  if (eop == 1) {
    op0 = *args;
    op = "cubeFaceIndexAMD";
  }
  else {
    if (eop != 2) {
      if (eop == 3) {
        ::std::__cxx11::string::string((string *)&expr,"timeAMD()",&local_4d);
        emit_op(this,result_type,id,&expr,true,false);
        register_control_dependent_expression(this,id);
        ::std::__cxx11::string::~string((string *)&expr);
        return;
      }
      statement<char_const(&)[40],unsigned_int&>
                (this,(char (*) [40])"// unimplemented SPV AMD gcn shader op ",&eop_local);
      return;
    }
    op0 = *args;
    op = "cubeFaceCoordAMD";
  }
  emit_unary_func_op(this,result_type,id,op0,op);
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_gcn_shader_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args,
                                              uint32_t)
{
	require_extension_internal("GL_AMD_gcn_shader");

	enum AMDGCNShader
	{
		CubeFaceIndexAMD = 1,
		CubeFaceCoordAMD = 2,
		TimeAMD = 3
	};

	auto op = static_cast<AMDGCNShader>(eop);

	switch (op)
	{
	case CubeFaceIndexAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceIndexAMD");
		break;
	case CubeFaceCoordAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceCoordAMD");
		break;
	case TimeAMD:
	{
		string expr = "timeAMD()";
		emit_op(result_type, id, expr, true);
		register_control_dependent_expression(id);
		break;
	}

	default:
		statement("// unimplemented SPV AMD gcn shader op ", eop);
		break;
	}
}